

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SocketMonitor_UNIX.cpp
# Opt level: O2

bool __thiscall FIX::SocketMonitor::addRead(SocketMonitor *this,socket_handle s)

{
  iterator iVar1;
  _Rb_tree_header *p_Var2;
  socket_handle local_1c;
  
  local_1c = s;
  socket_setnonblock(s);
  iVar1 = std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::find
                    (&(this->m_readSockets)._M_t,&local_1c);
  p_Var2 = &(this->m_readSockets)._M_t._M_impl.super__Rb_tree_header;
  if ((_Rb_tree_header *)iVar1._M_node == p_Var2) {
    std::_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>>::
    _M_insert_unique<int_const&>
              ((_Rb_tree<int,int,std::_Identity<int>,std::less<int>,std::allocator<int>> *)
               &this->m_readSockets,&local_1c);
  }
  return (_Rb_tree_header *)iVar1._M_node == p_Var2;
}

Assistant:

bool SocketMonitor::addRead(socket_handle s) {
  socket_setnonblock(s);
  Sockets::iterator i = m_readSockets.find(s);
  if (i != m_readSockets.end()) {
    return false;
  }

  m_readSockets.insert(s);
  return true;
}